

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint in_ESI;
  void *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  __m128i alVar1;
  void *in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i *rounding;
  __m128i *v_m1_b_00;
  __m128i *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint8_t *puVar2;
  void *local_78;
  
  rounding = (__m128i *)0x4040404040404040;
  v_m1_b_00 = (__m128i *)0x4040404040404040;
  local_78 = in_RDI;
  do {
    xx_loadl_32(in_stack_00000008);
    puVar2 = in_R8;
    alVar1 = blend_4_u8(in_R8,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58,v_m1_b_00,rounding);
    alVar1[0] = (longlong)in_R8;
    xx_storel_32(local_78,alVar1);
    local_78 = (void *)((long)local_78 + (ulong)in_ESI);
    in_R8 = puVar2 + in_R9D;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)v_res_b[0]);
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_w4_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                     const uint8_t *src0, uint32_t src0_stride,
                                     const uint8_t *src1, uint32_t src1_stride,
                                     const uint8_t *mask, uint32_t mask_stride,
                                     int w, int h) {
  (void)w;
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_m0_b = xx_loadl_32(mask);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);
    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}